

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O3

void __thiscall
TPZInterpolatedElement::RestrainSide
          (TPZInterpolatedElement *this,int side,TPZInterpolatedElement *large,int neighbourside)

{
  double dVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  long lVar11;
  TPZConnect *pTVar12;
  TPZGeoEl *pTVar13;
  ulong uVar14;
  TPZFMatrix<double> *this_00;
  double *pdVar15;
  long lVar16;
  int64_t myindex;
  int64_t iVar17;
  TPZDepend *pTVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  size_t lineN;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong local_35c0;
  TPZAutoPointer<TPZMatrix<double>_> local_3560;
  ulong local_3558;
  long *local_3550;
  REAL weight;
  TPZGeoElSide largegeoside;
  TPZGeoElSide thisgeoside;
  TPZCompElSide largecompside;
  TPZManVector<double,_3> pointl;
  TPZManVector<double,_3> par;
  TPZFMatrix<double> local_3488;
  double local_33f8 [21];
  TPZCompElSide thisside;
  TPZBlock MBlocksmall;
  TPZBlock MBlocklarge;
  TPZGeoElSide local_31a0;
  TPZStepSolver<double> MSolve;
  TPZFMatrix<double> local_3088;
  double local_2ff8 [101];
  TPZFMatrix<double> local_2cd0;
  double local_2c40 [101];
  TPZTransform<double> t;
  TPZFMatrix<double> local_2778;
  double local_26e8 [101];
  TPZFMatrix<double> local_23c0;
  double local_2330 [101];
  TPZFMatrix<double> local_2008;
  double local_1f78 [1001];
  
  thisside.fEl = (TPZCompEl *)this;
  thisside.fSide = side;
  TPZCompElSide::Reference(&thisgeoside,&thisside);
  largecompside.fEl = (TPZCompEl *)large;
  largecompside.fSide = neighbourside;
  TPZCompElSide::Reference(&largegeoside,&largecompside);
  if ((largecompside.fEl == (TPZCompEl *)0x0) ||
     (plVar10 = (long *)__dynamic_cast(largecompside.fEl,&TPZCompEl::typeinfo,&typeinfo,0),
     plVar10 == (long *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting RestrainSide - null computational element.",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    return;
  }
  iVar4 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x310))
                    (this,side);
  if (iVar4 < 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp",
               0x35c);
  }
  lVar11 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                     (this,iVar4);
  if (*(int *)(lVar11 + 0x18) == 0) {
    return;
  }
  if ((*(long *)(lVar11 + 0x20) != 0) && (iVar4 = TPZGeoElSide::Dimension(&largegeoside), 0 < iVar4)
     ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"RestrainSide - unnecessary call to restrainside",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp",
               0x365);
  }
  uVar5 = (**(code **)(*plVar10 + 0x310))(plVar10,largecompside.fSide);
  lVar11 = (**(code **)(*plVar10 + 0xa0))(plVar10,uVar5);
  if (lVar11 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting RestrainSide - Side of large element not initialized",
               0x3c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    lineN = 0x369;
LAB_0117b508:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp",
               lineN);
  }
  iVar4 = TPZGeoElSide::Dimension(&largegeoside);
  iVar6 = TPZGeoElSide::Dimension(&thisgeoside);
  if (iVar4 < iVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Exiting RestrainSide - Trying to restrict to a side of smaller dimension",0x48);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    lineN = 0x36e;
    goto LAB_0117b508;
  }
  iVar4 = TPZGeoElSide::Dimension(&thisgeoside);
  TPZTransform<double>::TPZTransform(&t,iVar4);
  local_31a0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  local_31a0.fGeoEl = largegeoside.fGeoEl;
  local_31a0.fSide = largegeoside.fSide;
  TPZGeoElSide::SideTransform3(&thisgeoside,&local_31a0,&t);
  iVar4 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x248))
                    (this,side);
  if (iVar4 < 1) {
    iVar4 = 2;
  }
  else {
    iVar6 = 0;
    uVar20 = 1;
    do {
      pTVar12 = SideConnect(this,iVar6,side);
      bVar2 = (pTVar12->field_2).fCompose.fOrder;
      if (uVar20 <= bVar2) {
        uVar20 = (uint)bVar2;
      }
      iVar6 = iVar6 + 1;
    } while (iVar4 != iVar6);
    iVar4 = uVar20 * 2;
  }
  iVar6 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x338))
                    (large,neighbourside);
  lVar11 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x318))
                     (this,side);
  if ((((int)(uint)*(byte *)(lVar11 + 0x14) < iVar6) &&
      (iVar6 = TPZGeoElSide::Dimension(&thisgeoside), iVar6 != 0)) &&
     (iVar6 = TPZGeoElSide::Dimension(&largegeoside), iVar6 != 0)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzintel.cpp",
               0x37d);
  }
  pTVar13 = TPZCompEl::Reference((TPZCompEl *)this);
  plVar10 = (long *)(**(code **)(*(long *)pTVar13 + 0x70))(pTVar13,side,iVar4);
  if (plVar10 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting RestrainSide - cannot create side integration rule",
               0x3a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    goto LAB_0117c7de;
  }
  iVar4 = (**(code **)(*plVar10 + 0x18))(plVar10);
  iVar6 = NSideShapeF(this,side);
  iVar7 = TPZGeoElSide::Dimension(&thisgeoside);
  iVar8 = TPZGeoElSide::Dimension(&largegeoside);
  iVar9 = NSideShapeF(large,neighbourside);
  lVar11 = (long)iVar6;
  local_3088.fElem = local_2ff8;
  local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018379e0;
  local_3088.fSize = 100;
  local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_3088.fGiven = local_3088.fElem;
  TPZVec<int>::TPZVec(&local_3088.fPivot.super_TPZVec<int>,0);
  local_3088.fPivot.super_TPZVec<int>.fStore = local_3088.fPivot.fExtAlloc;
  local_3088.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3088.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3088.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3088.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3088.fWork.fStore = (double *)0x0;
  local_3088.fWork.fNElements = 0;
  local_3088.fWork.fNAlloc = 0;
  if (iVar6 == 0) {
    local_3088.fElem = (double *)0x0;
  }
  else if (100 < iVar6) {
    local_3088.fElem = (double *)operator_new__(lVar11 * 8);
  }
  local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018376f0;
  local_23c0.fElem = local_2330;
  local_23c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_23c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_23c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_23c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018379e0;
  local_23c0.fSize = 100;
  local_23c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar11;
  local_23c0.fGiven = local_23c0.fElem;
  TPZVec<int>::TPZVec(&local_23c0.fPivot.super_TPZVec<int>,0);
  local_23c0.fPivot.super_TPZVec<int>.fStore = local_23c0.fPivot.fExtAlloc;
  local_23c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_23c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_23c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_23c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_23c0.fWork.fStore = (double *)0x0;
  local_23c0.fWork.fNElements = 0;
  local_23c0.fWork.fNAlloc = 0;
  if (iVar6 == 0) {
    local_23c0.fElem = (double *)0x0;
  }
  else if (0x32 < iVar6) {
    local_23c0.fElem = (double *)operator_new__(lVar11 << 4);
  }
  local_23c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018376f0;
  lVar19 = (long)iVar9;
  local_2cd0.fElem = local_2c40;
  local_2cd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_2cd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2cd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2cd0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018379e0;
  local_2cd0.fSize = 100;
  local_2cd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar19;
  local_2cd0.fGiven = local_2cd0.fElem;
  TPZVec<int>::TPZVec(&local_2cd0.fPivot.super_TPZVec<int>,0);
  local_2cd0.fPivot.super_TPZVec<int>.fStore = local_2cd0.fPivot.fExtAlloc;
  local_2cd0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2cd0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2cd0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2cd0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2cd0.fWork.fStore = (double *)0x0;
  local_2cd0.fWork.fNElements = 0;
  local_2cd0.fWork.fNAlloc = 0;
  if (iVar9 == 0) {
    local_2cd0.fElem = (double *)0x0;
  }
  else if (100 < iVar9) {
    local_2cd0.fElem = (double *)operator_new__(lVar19 * 8);
  }
  local_2cd0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018376f0;
  local_2778.fElem = local_26e8;
  local_2778.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_2778.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2778.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2778.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018379e0;
  local_2778.fSize = 100;
  local_2778.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar19;
  local_2778.fGiven = local_2778.fElem;
  TPZVec<int>::TPZVec(&local_2778.fPivot.super_TPZVec<int>,0);
  local_2778.fPivot.super_TPZVec<int>.fStore = local_2778.fPivot.fExtAlloc;
  local_2778.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2778.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2778.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2778.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2778.fWork.fStore = (double *)0x0;
  local_2778.fWork.fNElements = 0;
  local_2778.fWork.fNAlloc = 0;
  if (iVar9 == 0) {
    local_2778.fElem = (double *)0x0;
  }
  else if (0x32 < iVar9) {
    local_2778.fElem = (double *)operator_new__(lVar19 << 4);
  }
  local_2778.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018376f0;
  local_2008.fElem = local_1f78;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185cc10;
  local_2008.fSize = 1000;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar19;
  local_2008.fGiven = local_2008.fElem;
  TPZVec<int>::TPZVec(&local_2008.fPivot.super_TPZVec<int>,0);
  local_2008.fPivot.super_TPZVec<int>.fStore = local_2008.fPivot.fExtAlloc;
  local_2008.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2008.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2008.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2008.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2008.fWork.fStore = (double *)0x0;
  local_2008.fWork.fNElements = 0;
  local_2008.fWork.fNAlloc = 0;
  uVar14 = lVar19 * lVar11;
  if (uVar14 == 0) {
    local_2008.fElem = (double *)0x0;
  }
  else if (1000 < (long)uVar14) {
    local_2008.fElem = (double *)operator_new__(-(ulong)(uVar14 >> 0x3d != 0) | uVar14 * 8);
  }
  local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185c920;
  TPZFMatrix<double>::operator=(&local_2008,0.0);
  this_00 = (TPZFMatrix<double> *)operator_new(0x1fd8);
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = lVar11;
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = lVar11;
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185cc10;
  this_00->fElem = (double *)(this_00 + 1);
  this_00->fGiven = (double *)(this_00 + 1);
  this_00->fSize = 1000;
  TPZVec<int>::TPZVec(&(this_00->fPivot).super_TPZVec<int>,0);
  (this_00->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this_00->fPivot).super_TPZVec<int>.fStore = (this_00->fPivot).fExtAlloc;
  (this_00->fPivot).super_TPZVec<int>.fNElements = 0;
  (this_00->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this_00->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this_00->fWork).fStore = (double *)0x0;
  (this_00->fWork).fNElements = 0;
  (this_00->fWork).fNAlloc = 0;
  if (iVar6 == 0) {
    pdVar15 = (double *)0x0;
LAB_0117bb51:
    this_00->fElem = pdVar15;
  }
  else {
    uVar14 = lVar11 * lVar11;
    if (1000 < uVar14) {
      pdVar15 = (double *)operator_new__(-(ulong)(uVar14 >> 0x3d != 0) | uVar14 * 8);
      goto LAB_0117bb51;
    }
  }
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185c920;
  TPZFMatrix<double>::operator=(this_00,0.0);
  TPZManVector<double,_3>::TPZManVector(&par,(long)iVar7);
  local_3550 = plVar10;
  TPZManVector<double,_3>::TPZManVector(&pointl,(long)iVar8);
  if (0 < iVar4) {
    iVar7 = 0;
    do {
      (**(code **)(*local_3550 + 0x20))(local_3550,iVar7,&par,&weight);
      (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x288))
                (this,side,&par,&local_3088,&local_23c0);
      TPZTransform<double>::Apply(&t,&par.super_TPZVec<double>,&pointl.super_TPZVec<double>);
      (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x288))
                (large,neighbourside,&pointl,&local_2cd0,&local_2778);
      if (0 < iVar6) {
        lVar24 = 0;
        do {
          lVar21 = 0;
          do {
            if ((local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar24) ||
               (local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar21) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar16 = (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar16 <= lVar24) ||
               ((this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar21)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar16 = lVar16 * lVar21;
            this_00->fElem[lVar16 + lVar24] =
                 local_3088.fElem[lVar24] * local_3088.fElem[lVar21] * weight +
                 this_00->fElem[lVar16 + lVar24];
            lVar21 = lVar21 + 1;
          } while (lVar11 != lVar21);
          if (0 < iVar9) {
            lVar21 = 0;
            do {
              if ((local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar24) ||
                 (local_3088.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_2cd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar21) ||
                 (local_2cd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar24) ||
                 (local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar21)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_2008.fElem
              [local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar21 + lVar24] =
                   local_3088.fElem[lVar24] * local_2cd0.fElem[lVar21] * weight +
                   local_2008.fElem
                   [local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar21 + lVar24];
              lVar21 = lVar21 + 1;
            } while (lVar19 != lVar21);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != lVar11);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar4);
  }
  local_3560.fRef = (TPZReference *)0x0;
  local_3560.fRef = (TPZReference *)operator_new(0x10);
  ((local_3560.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_3560.fRef)->fPointer = (TPZMatrix<double> *)this_00;
  LOCK();
  ((local_3560.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(&MSolve,&local_3560);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3560);
  TPZStepSolver<double>::SetDirect(&MSolve,ELU);
  TPZStepSolver<double>::Solve(&MSolve,&local_2008,&local_2008,(TPZFMatrix<double> *)0x0);
  iVar4 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x248))
                    (this,side);
  iVar6 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x248))
                    (large);
  TPZBlock::TPZBlock(&MBlocksmall,(TPZBaseMatrix *)0x0,iVar4,1);
  TPZBlock::TPZBlock(&MBlocklarge,(TPZBaseMatrix *)0x0,iVar6,1);
  local_3558 = (ulong)iVar4;
  if (0 < iVar4) {
    uVar14 = 0;
    do {
      uVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x250))
                        (this,uVar14 & 0xffffffff,side);
      lVar11 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                         (this,uVar5);
      TPZBlock::Set(&MBlocksmall,(int)uVar14,*(int *)(lVar11 + 0x18),-1);
      uVar14 = uVar14 + 1;
    } while (local_3558 != uVar14);
  }
  uVar14 = (ulong)iVar6;
  if (0 < iVar6) {
    uVar22 = 0;
    do {
      uVar5 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x250))
                        (large,uVar22 & 0xffffffff,neighbourside);
      lVar11 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                         (large,uVar5);
      TPZBlock::Set(&MBlocklarge,(int)uVar22,*(int *)(lVar11 + 0x18),-1);
      uVar22 = uVar22 + 1;
    } while (uVar14 != uVar22);
  }
  TPZBlock::Resequence(&MBlocksmall,0);
  TPZBlock::Resequence(&MBlocklarge,0);
  uVar22 = local_3558;
  local_3488.fElem = local_33f8;
  local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = local_3558;
  local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816bf8;
  local_3488.fSize = 0x14;
  local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar14;
  local_3488.fGiven = local_3488.fElem;
  TPZVec<int>::TPZVec(&local_3488.fPivot.super_TPZVec<int>,0);
  local_3488.fPivot.super_TPZVec<int>.fStore = local_3488.fPivot.fExtAlloc;
  local_3488.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3488.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3488.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3488.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3488.fWork.fStore = (double *)0x0;
  local_3488.fWork.fNElements = 0;
  local_3488.fWork.fNAlloc = 0;
  uVar22 = uVar14 * uVar22;
  if (uVar22 == 0) {
    local_3488.fElem = (double *)0x0;
  }
  else if (0x14 < (long)uVar22) {
    local_3488.fElem = (double *)operator_new__(-(ulong)(uVar22 >> 0x3d != 0) | uVar22 * 8);
  }
  local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01816908;
  TPZFMatrix<double>::operator=(&local_3488,0.0);
  if (0 < iVar4) {
    uVar22 = 0;
    do {
      uVar20 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar22].dim;
      if ((ulong)uVar20 != 0 && 0 < iVar6) {
        uVar25 = 0;
        do {
          uVar3 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar25].dim;
          if ((ulong)uVar3 != 0) {
            if (0 < (int)uVar20) {
              iVar7 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar22].pos;
              iVar8 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)uVar25].pos;
              local_35c0 = 0;
              do {
                if (0 < (int)uVar3) {
                  lVar11 = local_35c0 + (long)iVar7;
                  uVar23 = (ulong)uVar3;
                  lVar19 = (long)iVar8;
                  do {
                    if (((local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar11 ||
                          lVar11 < 0) || (lVar19 < 0)) ||
                       (local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar19)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    if (((local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar11 ||
                          lVar11 < 0) || (lVar19 < 0)) ||
                       (local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar19)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    if ((local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar22
                        ) || (local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <=
                              (long)uVar25)) {
                      TPZFMatrix<double>::Error
                                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                      pzinternal::DebugStopImpl
                                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                 ,0x26d);
                    }
                    local_3488.fElem
                    [local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar25 + uVar22]
                         = ABS(local_2008.fElem
                               [local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar19
                                + lVar11]) *
                           ABS(local_2008.fElem
                               [local_2008.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar19
                                + lVar11]) +
                           local_3488.fElem
                           [local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar25 +
                            uVar22];
                    lVar19 = lVar19 + 1;
                    uVar23 = uVar23 - 1;
                  } while (uVar23 != 0);
                }
                local_35c0 = local_35c0 + 1;
              } while (local_35c0 != uVar20);
            }
            if ((local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar22) ||
               (local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar25)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar11 = local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar25;
            local_3488.fElem[lVar11 + uVar22] =
                 local_3488.fElem[lVar11 + uVar22] / (double)(int)(uVar20 * uVar3);
            if ((local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar22) ||
               (local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar25)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar1 = local_3488.fElem[lVar11 + uVar22];
            if (dVar1 < 0.0) {
              dVar1 = sqrt(dVar1);
            }
            else {
              dVar1 = SQRT(dVar1);
            }
            if ((local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar22) ||
               (local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar25)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_3488.fElem
            [local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar25 + uVar22] = dVar1;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar14);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != local_3558);
  }
  uVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x310))
                    (this,side);
  pTVar12 = (TPZConnect *)
            (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                      (this,uVar5);
  uVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x310))
                    (this,side);
  myindex = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa0))
                      (this,uVar5);
  if (0 < iVar6) {
    lVar11 = (long)(iVar4 + -1);
    lVar19 = 0xc;
    lVar24 = 0;
    uVar22 = 0;
    do {
      if ((MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar11].dim != 0) &&
         (*(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                          super_TPZSavable)._vptr_TPZSavable + lVar19) != 0)) {
        uVar5 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x250)
                )(large,uVar22 & 0xffffffff,neighbourside);
        iVar17 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0xa0)
                 )(large,uVar5);
        pTVar18 = TPZConnect::AddDependency
                            (pTVar12,myindex,iVar17,&local_2008,
                             (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar11].
                                   pos,
                             (long)*(int *)((long)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.
                                                  fStore + lVar19 + -4),
                             MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar11].dim,
                             *(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.
                                              fStore)->super_TPZSavable)._vptr_TPZSavable + lVar19))
        ;
        if ((iVar4 < 1) ||
           ((local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar11 ||
            (local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar22)))) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (local_3488.fElem
            [local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar22 + lVar11] <= 1e-08
            && local_3488.fElem
               [local_3488.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar22 + lVar11] !=
               1e-08) {
          memset((pTVar18->fDepMatrix).super_TPZFMatrix<double>.fElem,0,
                 (pTVar18->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow *
                 (pTVar18->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fCol * 8);
          (pTVar18->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
          .fDecomposed = '\0';
        }
        lVar24 = lVar24 + 1;
      }
      uVar22 = uVar22 + 1;
      lVar19 = lVar19 + 0x10;
    } while (uVar14 != uVar22);
    if (lVar24 == 0 && 0 < iVar6) {
      lVar19 = 0xc;
      uVar22 = 0;
      do {
        uVar5 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x250)
                )(large,uVar22 & 0xffffffff,neighbourside);
        iVar17 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0xa0)
                 )(large,uVar5);
        iVar4 = *(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                                super_TPZSavable)._vptr_TPZSavable + lVar19);
        if (iVar4 != 0) {
          TPZConnect::AddDependency
                    (pTVar12,myindex,iVar17,&local_2008,
                     (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar11].pos,
                     (long)*(int *)((long)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore +
                                   lVar19 + -4),
                     MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar11].dim,iVar4);
        }
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0x10;
      } while (uVar14 != uVar22);
    }
  }
  (**(code **)(*local_3550 + 8))();
  TPZFMatrix<double>::~TPZFMatrix(&local_3488,&PTR_PTR_01816bc0);
  TPZBlock::~TPZBlock(&MBlocklarge);
  TPZBlock::~TPZBlock(&MBlocksmall);
  TPZStepSolver<double>::~TPZStepSolver(&MSolve);
  TPZManVector<double,_3>::~TPZManVector(&pointl);
  TPZManVector<double,_3>::~TPZManVector(&par);
  TPZFMatrix<double>::~TPZFMatrix(&local_2008,&PTR_PTR_0185cbd8);
  TPZFMatrix<double>::~TPZFMatrix(&local_2778,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix(&local_2cd0,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix(&local_23c0,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix(&local_3088,&PTR_PTR_018379a8);
LAB_0117c7de:
  TPZTransform<double>::~TPZTransform(&t);
  return;
}

Assistant:

void TPZInterpolatedElement::RestrainSide(int side, TPZInterpolatedElement *large, int neighbourside) {
    TPZCompElSide thisside(this, side);
    TPZGeoElSide thisgeoside = thisside.Reference();
    TPZCompElSide largecompside(large, neighbourside);
    TPZGeoElSide largegeoside = largecompside.Reference();
    TPZInterpolatedElement *cel = nullptr;
    if (largecompside.Exists()) cel = dynamic_cast<TPZInterpolatedElement *> (largecompside.Element());
    if (!cel) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - null computational element.");
        return;
    }
    int locind = MidSideConnectLocId(side);
    if (locind < 0) {
        DebugStop();
    }
    TPZConnect &myconnect = Connect(locind);
    if (myconnect.NShape() == 0) {
        /// no shape functions to restrain
        return;
    }
    if (myconnect.HasDependency() && largegeoside.Dimension() > 0) {
        LOGPZ_WARN(logger, "RestrainSide - unnecessary call to restrainside");
        DebugStop();
    }
    if (cel->ConnectIndex(cel->MidSideConnectLocId(largecompside.Side())) == -1) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Side of large element not initialized");
        DebugStop();
        return;
    }
    if (largegeoside.Dimension() < thisgeoside.Dimension()) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Trying to restrict to a side of smaller dimension");
        DebugStop();
        return;
    }
    TPZTransform<> t(thisgeoside.Dimension());
    thisgeoside.SideTransform3(largegeoside, t);
    int nsideconnects = NSideConnects(side);
    int maxord = 1;
    for (int sidecon = 0; sidecon < nsideconnects; sidecon++) {
        TPZConnect &c = SideConnect(sidecon, side);
        int sideord = c.Order();
        maxord = maxord < sideord ? sideord : maxord;
    }
    int largeorder = large->EffectiveSideOrder(neighbourside);
    int sideorder = MidSideConnect(side).Order();
    if (sideorder < largeorder && thisgeoside.Dimension() && largegeoside.Dimension()) {
        DebugStop();
    }
    TPZIntPoints *intrule = Reference()->CreateSideIntegrationRule(side, maxord * 2);
    if (!intrule) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - cannot create side integration rule");
        return;
    }
    int numint = intrule->NPoints();
    int numshape = NSideShapeF(side);
    int sidedimension = thisgeoside.Dimension();
    int largesidedimension = largegeoside.Dimension();
    int numshapel = large->NSideShapeF(neighbourside);
    TPZFNMatrix<100, REAL> phis(numshape, 1), dphis(2, numshape), phil(numshapel, 1), dphil(2, numshapel);
    TPZFNMatrix<1000, REAL> MSL(numshape, numshapel, 0.);
    TPZFNMatrix<1000, REAL> *M = new TPZFNMatrix<1000, REAL>(numshape, numshape, 0.);
    TPZManVector<REAL, 3> par(sidedimension), pointl(largesidedimension); //,point(3);
    int64_t in, jn;
    REAL weight;
    for (int it = 0; it < numint; it++) {
        intrule->Point(it, par, weight);
        SideShapeFunction(side, par, phis, dphis);
        t.Apply(par, pointl);
        large->SideShapeFunction(neighbourside, pointl, phil, dphil);
        for (in = 0; in < numshape; in++) {
            for (jn = 0; jn < numshape; jn++) {
                (*M)(in, jn) += phis(in, 0) * phis(jn, 0) * weight;
            }
            for (jn = 0; jn < numshapel; jn++) {
                MSL(in, jn) += phis(in, 0) * phil(jn, 0) * weight;
            }
        }
    }
#ifdef PZ_LOG_keep
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        M->Print("MSS = ", sout, EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    TPZStepSolver<REAL> MSolve(M);
    MSolve.SetDirect(ELU);

    MSolve.Solve(MSL, MSL);

    //MSolve.ResetMatrix();
    int numsidenodes_small = NSideConnects(side);
    // Philippe 12/3/99
    //  int numsidenodes_large = NSideConnects(neighbourside);
    int numsidenodes_large = large->NSideConnects(neighbourside);
    TPZBlock MBlocksmall(0, numsidenodes_small), MBlocklarge(0, numsidenodes_large);
    for (in = 0; in < numsidenodes_small; in++) {
        int locid = SideConnectLocId(in, side);
        TPZConnect &c = Connect(locid);
#ifdef PZDEBUG
        if (NConnectShapeF(locid, c.Order()) != c.NShape()) {
            DebugStop();
        }
#endif
        unsigned int nshape = c.NShape();
        MBlocksmall.Set(in, nshape);
    }
    for (in = 0; in < numsidenodes_large; in++) {
        int locid = large->SideConnectLocId(in, neighbourside);
        TPZConnect &c = large->Connect(locid);
        unsigned int nshape = c.NShape();
#ifdef PZDEBUG
        if (large->NConnectShapeF(locid, c.Order()) != nshape) {
            DebugStop();
        }
#endif
        MBlocklarge.Set(in, nshape);
    }

    MBlocksmall.Resequence();
    MBlocklarge.Resequence();
    TPZFNMatrix<20, REAL> blocknorm(numsidenodes_small, numsidenodes_large, 0.);
    for (in = 0; in < numsidenodes_small; in++) {
        int ibl = MBlocksmall.Size(in);
        if (!ibl) continue;
        for (jn = 0; jn < numsidenodes_large; jn++) {
            int jbl = MBlocklarge.Size(jn);
            if (!jbl) continue;
            int i, j;
            int64_t ipos = MBlocksmall.Position(in);
            int64_t jpos = MBlocklarge.Position(jn);
            for (i = 0; i < ibl; i++) for (j = 0; j < jbl; j++) blocknorm(in, jn) += fabs(MSL(ipos + i, jpos + j)) * fabs(MSL(ipos + i, jpos + j));
            blocknorm(in, jn) /= (ibl * jbl);
            blocknorm(in, jn) = sqrt(blocknorm(in, jn));
        }
    }
#ifdef PZDEBUG
    CheckConstraintConsistency(side);
#endif
    TPZConnect &inod = Connect(MidSideConnectLocId(side));
    int64_t inodindex = ConnectIndex(MidSideConnectLocId(side));
    int64_t ndepend = 0;
    in = numsidenodes_small - 1;
#ifdef PZDEBUG
    if (MBlocksmall.Size(in) == 0) {
        DebugStop();
    }
#endif
    for (jn = 0; jn < numsidenodes_large; jn++) {
        if (MBlocksmall.Size(in) == 0 || MBlocklarge.Size(jn) == 0) {
            continue;
        }
        int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
        TPZConnect::TPZDepend *depend = inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                MBlocksmall.Size(in), MBlocklarge.Size(jn));
        if (blocknorm(in, jn) < 1.e-8) {
            depend->fDepMatrix.Zero();
        }
        ndepend++;
    }

    if (!ndepend) {
        //cout << "Caso esquisito!!! Chame o Boss que vc receberem premio\n";
        for (jn = 0; jn < numsidenodes_large; jn++) {
            int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
            if (MBlocklarge.Size(jn)) {
                inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                        MBlocksmall.Size(in), MBlocklarge.Size(jn));
            }
            ndepend++;
        }
    }
    delete intrule;

#ifdef HUGE_DEBUG
    // a matriz frestraint deveria ser igual a MSL
    TPZCheckRestraint test(thisside, largecompside);
    //test.Print(cout);
    int64_t imsl, jmsl;
    int64_t rmsl = MSL.Rows();
    int64_t cmsl = MSL.Cols();
    int64_t rtest = test.RestraintMatrix().Rows();
    int64_t ctest = test.RestraintMatrix().Cols();

    if (rtest != rmsl || ctest != cmsl) {
        stringstream sout;
        sout << "Exiting - Restraint matrix side incompatibility: MSL (rows,cols): ( " << rmsl
                << " , " << cmsl << " )" << " RestraintMatrix (rows,cols): (" << rtest << " , " << ctest << " )\n"
                << "press any key to continue";
        LOGPZ_ERROR(logger, sout.str());
        int a;
        cin >> a;
        return;
    }

    TPZFMatrix<REAL> mslc(MSL);
    mslc -= test.RestraintMatrix();

    REAL normmsl = 0.;
    for (imsl = 0; imsl < rmsl; imsl++) {
        for (jmsl = 0; jmsl < cmsl; jmsl++) {
            normmsl += sqrt(mslc(imsl, jmsl) * mslc(imsl, jmsl));
        }
    }
    if (normmsl > 1.E-6) {
        stringstream sout;
        sout << "TPZInterpolatedElement::Error::MSL matrix has non zero norm " << normmsl << "\n";
        mslc.Print("Difference Matrix ", sout);
        for (imsl = 0; imsl < rmsl; imsl++) {
            for (jmsl = 0; jmsl < cmsl; jmsl++) {
                if (fabs(MSL(imsl, jmsl) - test.RestraintMatrix()(imsl, jmsl)) > 1.E-6) {
                    sout << "msl[ " << imsl << " , " << jmsl << " ] = " << MSL(imsl, jmsl) << "\t "
                            << test.RestraintMatrix()(imsl, jmsl) << endl;
                }
            }
        }
        LOGPZ_ERROR(logger, sout.str());
        //     int a;
        //     gDebug = 1;
        //     cin >> a;
    }

    // verificar a norma de MSL
    if (test.CheckRestraint()) {
        stringstream sout
        sout << "TPZInterpolatedElement::Error::Bad restraints detected\n"; // recado de erro.
        test.Print(sout);
        //     int a;
        //     gDebug = 1;
        //     cin >> a;
        test.Diagnose();
        LOGPZ_ERROR(logger, sout.str());
        TPZCheckRestraint test2(thisside, largecompside);
    }
#endif
}